

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O0

BindDirectiveSyntax * __thiscall
slang::parsing::Parser::parseBindDirective(Parser *this,AttrList attr)

{
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> elements;
  Token colon_00;
  span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> elements_00;
  span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> elements_01;
  Token bind;
  Token bind_00;
  SourceRange range;
  AttrList attributes;
  bool bVar1;
  Info *pIVar2;
  CheckerInstantiationSyntax *targetInstances_00;
  HierarchyInstantiationSyntax *targetInstances_01;
  EVP_PKEY_CTX *src;
  __extent_storage<18446744073709551615UL> in_RSI;
  pointer in_RDI;
  Token TVar3;
  Token TVar4;
  SmallVector<slang::syntax::TokenOrSyntax,_4UL> names;
  Token colon;
  BindTargetListSyntax *targetInstances;
  NameSyntax *target;
  Token keyword;
  SeparatedSyntaxList<slang::syntax::NameSyntax> *in_stack_fffffffffffffcf8;
  Parser *in_stack_fffffffffffffd00;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *this_00;
  undefined6 in_stack_fffffffffffffd08;
  undefined6 uVar5;
  TokenKind in_stack_fffffffffffffd0e;
  undefined2 uVar6;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffd10;
  ParserBase *in_stack_fffffffffffffd18;
  pointer ppAVar7;
  SourceLocation in_stack_fffffffffffffd20;
  SourceLocation in_stack_fffffffffffffd28;
  undefined4 in_stack_fffffffffffffd30;
  DiagCode in_stack_fffffffffffffd34;
  uint uVar8;
  SyntaxNode *in_stack_fffffffffffffd50;
  TokenKind local_1b0;
  TokenKind local_1a0;
  Parser *in_stack_ffffffffffffff20;
  AttrList in_stack_ffffffffffffff28;
  BindTargetListSyntax *local_40;
  BindDirectiveSyntax *local_8;
  
  ppAVar7 = in_RDI;
  TVar3 = ParserBase::consume((ParserBase *)in_stack_fffffffffffffd20);
  pIVar2 = (Info *)parseName(in_stack_fffffffffffffd00);
  local_40 = (BindTargetListSyntax *)0x0;
  bVar1 = ParserBase::peek((ParserBase *)in_stack_fffffffffffffd10._M_extent_value,
                           in_stack_fffffffffffffd0e);
  if (bVar1) {
    if (*(int *)&pIVar2->rawTextPtr != 0xe5) {
      slang::syntax::SyntaxNode::sourceRange(in_stack_fffffffffffffd50);
      range.endLoc = in_stack_fffffffffffffd28;
      range.startLoc = in_stack_fffffffffffffd20;
      ParserBase::addDiag(in_stack_fffffffffffffd18,in_stack_fffffffffffffd34,range);
    }
    ParserBase::consume((ParserBase *)in_stack_fffffffffffffd20);
    SmallVector<slang::syntax::TokenOrSyntax,_4UL>::SmallVector
              ((SmallVector<slang::syntax::TokenOrSyntax,_4UL> *)0x8a6268);
    while( true ) {
      parseName(in_stack_fffffffffffffd00);
      slang::syntax::TokenOrSyntax::TokenOrSyntax
                ((TokenOrSyntax *)in_stack_fffffffffffffd00,(SyntaxNode *)in_stack_fffffffffffffcf8)
      ;
      SmallVectorBase<slang::syntax::TokenOrSyntax>::push_back
                ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)in_stack_fffffffffffffd00,
                 (TokenOrSyntax *)in_stack_fffffffffffffcf8);
      bVar1 = ParserBase::peek((ParserBase *)in_stack_fffffffffffffd10._M_extent_value,
                               in_stack_fffffffffffffd0e);
      if (!bVar1) break;
      ParserBase::consume((ParserBase *)in_stack_fffffffffffffd20);
      TVar4.rawLen._2_2_ = in_stack_fffffffffffffd0e;
      TVar4._0_6_ = in_stack_fffffffffffffd08;
      TVar4.info = (Info *)in_stack_fffffffffffffd10._M_extent_value;
      slang::syntax::TokenOrSyntax::TokenOrSyntax((TokenOrSyntax *)in_stack_fffffffffffffd00,TVar4);
      SmallVectorBase<slang::syntax::TokenOrSyntax>::push_back
                ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)in_stack_fffffffffffffd00,
                 (TokenOrSyntax *)in_stack_fffffffffffffcf8);
    }
    SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
              ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)&stack0xffffffffffffff20,
               (EVP_PKEY_CTX *)*in_RDI,src);
    elements._M_ptr._6_2_ = in_stack_fffffffffffffd0e;
    elements._M_ptr._0_6_ = in_stack_fffffffffffffd08;
    elements._M_extent._M_extent_value = in_stack_fffffffffffffd10._M_extent_value;
    slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>::SeparatedSyntaxList
              ((SeparatedSyntaxList<slang::syntax::NameSyntax> *)in_stack_fffffffffffffd00,elements)
    ;
    colon_00.rawLen._2_2_ = in_stack_fffffffffffffd0e;
    colon_00._0_6_ = in_stack_fffffffffffffd08;
    colon_00.info = (Info *)in_stack_fffffffffffffd10._M_extent_value;
    local_40 = slang::syntax::SyntaxFactory::bindTargetList
                         ((SyntaxFactory *)in_stack_fffffffffffffd00,colon_00,
                          in_stack_fffffffffffffcf8);
    SmallVector<slang::syntax::TokenOrSyntax,_4UL>::~SmallVector
              ((SmallVector<slang::syntax::TokenOrSyntax,_4UL> *)0x8a6423);
  }
  *(undefined1 *)((long)in_RDI + 0x1c9) = 1;
  bVar1 = ParserBase::peek((ParserBase *)in_stack_fffffffffffffd10._M_extent_value,
                           in_stack_fffffffffffffd0e);
  uVar8 = (uint)in_stack_fffffffffffffd34 & 0xffffff;
  if (bVar1) {
    TVar4 = ParserBase::peek((ParserBase *)
                             CONCAT26(in_stack_fffffffffffffd0e,in_stack_fffffffffffffd08),
                             (uint32_t)((ulong)in_stack_fffffffffffffd00 >> 0x20));
    local_1a0 = TVar4.kind;
    uVar8 = uVar8 & 0xffffff;
    if (local_1a0 == DoubleColon) {
      TVar4 = ParserBase::peek((ParserBase *)
                               CONCAT26(in_stack_fffffffffffffd0e,in_stack_fffffffffffffd08),
                               (uint32_t)((ulong)in_stack_fffffffffffffd00 >> 0x20));
      local_1b0 = TVar4.kind;
      uVar8 = CONCAT13(local_1b0 == Identifier,(int3)uVar8);
    }
  }
  if ((char)(uVar8 >> 0x18) == '\0') {
    this_00 = (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)(in_RDI + 0x1c);
    elements_01._M_ptr._6_2_ = in_stack_fffffffffffffd0e;
    elements_01._M_ptr._0_6_ = in_stack_fffffffffffffd08;
    elements_01._M_extent._M_extent_value = in_stack_fffffffffffffd10._M_extent_value;
    slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
              (this_00,elements_01);
    uVar5 = SUB86(pIVar2,0);
    uVar6 = (undefined2)((ulong)pIVar2 >> 0x30);
    std::span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>::span
              ((span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> *)0x8a6645);
    attributes._M_extent._M_extent_value = in_RSI._M_extent_value;
    attributes._M_ptr = ppAVar7;
    targetInstances_01 = parseHierarchyInstantiation((Parser *)TVar3.info,attributes);
    bind_00.info = (Info *)in_stack_fffffffffffffd20;
    bind_00._0_8_ = in_stack_fffffffffffffd18;
    local_8 = slang::syntax::SyntaxFactory::bindDirective
                        ((SyntaxFactory *)local_40,
                         (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)CONCAT26(uVar6,uVar5)
                         ,bind_00,(NameSyntax *)this_00,(BindTargetListSyntax *)targetInstances_01,
                         (MemberSyntax *)CONCAT44(uVar8,in_stack_fffffffffffffd30));
  }
  else {
    ppAVar7 = in_RDI + 0x1c;
    elements_00._M_ptr._6_2_ = in_stack_fffffffffffffd0e;
    elements_00._M_ptr._0_6_ = in_stack_fffffffffffffd08;
    elements_00._M_extent._M_extent_value = in_stack_fffffffffffffd10._M_extent_value;
    slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
              ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)in_stack_fffffffffffffd00,
               elements_00);
    std::span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>::span
              ((span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> *)0x8a6554);
    targetInstances_00 =
         parseCheckerInstantiation(in_stack_ffffffffffffff20,in_stack_ffffffffffffff28);
    bind.info = pIVar2;
    bind._0_8_ = ppAVar7;
    local_8 = slang::syntax::SyntaxFactory::bindDirective
                        ((SyntaxFactory *)in_stack_fffffffffffffd10._M_extent_value,
                         (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                         CONCAT26(in_stack_fffffffffffffd0e,in_stack_fffffffffffffd08),bind,
                         (NameSyntax *)in_stack_fffffffffffffd00,
                         (BindTargetListSyntax *)targetInstances_00,
                         (MemberSyntax *)CONCAT44(uVar8,in_stack_fffffffffffffd30));
  }
  return local_8;
}

Assistant:

BindDirectiveSyntax& Parser::parseBindDirective(AttrList attr) {
    Token keyword = consume();
    auto& target = parseName();

    BindTargetListSyntax* targetInstances = nullptr;
    if (peek(TokenKind::Colon)) {
        if (target.kind != SyntaxKind::IdentifierName)
            addDiag(diag::BindDirectiveInvalidName, target.sourceRange());

        auto colon = consume();

        SmallVector<TokenOrSyntax, 4> names;
        while (true) {
            names.push_back(&parseName());
            if (!peek(TokenKind::Comma))
                break;

            names.push_back(consume());
        }

        targetInstances = &factory.bindTargetList(colon, names.copy(alloc));
    }

    meta.hasBindDirectives = true;

    if (peek(TokenKind::Identifier) && peek(1).kind == TokenKind::DoubleColon &&
        peek(2).kind == TokenKind::Identifier) {
        return factory.bindDirective(attr, keyword, target, targetInstances,
                                     parseCheckerInstantiation({}));
    }
    else {
        return factory.bindDirective(attr, keyword, target, targetInstances,
                                     parseHierarchyInstantiation({}));
    }
}